

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.cpp
# Opt level: O2

void __thiscall
ser::Serializer::Init(Serializer *this,string *directory,string *prefix,SerializerOpenMode mode)

{
  MetainfoSet *globalMetainfo;
  shared_ptr<ser::FileFormat> *this_00;
  SerializerOpenMode SVar1;
  bool bVar2;
  int iVar3;
  char *__nptr;
  CentralizedFileFormat *this_01;
  type this_02;
  type pFVar4;
  allocator local_81;
  string local_80;
  shared_ptr<ser::CentralizedFileFormat> fileFormat;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (enabled_ == 0) {
    __nptr = getenv("STELLA_SERIALIZATION_DISABLED");
    if (__nptr == (char *)0x0) {
      enabled_ = 1;
    }
    else {
      iVar3 = atoi(__nptr);
      enabled_ = (uint)(iVar3 < 1) * 2 + -1;
    }
  }
  this->mode_ = mode;
  this_01 = (CentralizedFileFormat *)operator_new(0x80);
  CentralizedFileFormat::CentralizedFileFormat(this_01);
  boost::shared_ptr<ser::CentralizedFileFormat>::shared_ptr<ser::CentralizedFileFormat>
            (&fileFormat,this_01);
  this_02 = boost::shared_ptr<ser::CentralizedFileFormat>::operator->(&fileFormat);
  globalMetainfo = &this->globalMetainfo_;
  CentralizedFileFormat::Init
            (this_02,directory,prefix,globalMetainfo,&this->fieldsTable_,&this->offsetTable_);
  this_00 = &this->pFileFormat_;
  boost::shared_ptr<ser::FileFormat>::operator=(this_00,&fileFormat);
  SVar1 = this->mode_;
  pFVar4 = boost::shared_ptr<ser::FileFormat>::operator->(this_00);
  (*pFVar4->_vptr_FileFormat[(ulong)(SVar1 == SerializerOpenModeWrite) * 2 + 3])(pFVar4);
  std::__cxx11::string::string((string *)&local_80,"__format",(allocator *)&local_50);
  bVar2 = MetainfoSet::HasKey(globalMetainfo,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  if (!bVar2) {
    std::__cxx11::string::string((string *)&local_80,"__format",&local_81);
    pFVar4 = boost::shared_ptr<ser::FileFormat>::operator->(this_00);
    (*pFVar4->_vptr_FileFormat[2])(&local_50,pFVar4);
    MetainfoSet::AddMetainfo<std::__cxx11::string>(globalMetainfo,&local_80,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_80);
  }
  boost::detail::shared_count::~shared_count(&fileFormat.pn);
  return;
}

Assistant:

void Serializer::Init(const std::string& directory, const std::string& prefix, SerializerOpenMode mode)
{
    // Set the enabled_ flag to something different than 0
    if (enabled_ == 0)
    {
        const char* envvar = std::getenv("STELLA_SERIALIZATION_DISABLED");
        enabled_ = (envvar && std::atoi(envvar) > 0) ? -1 : 1;
    }

    mode_ = mode;

    // Initialize file type, as it will also fill the tables
    boost::shared_ptr<CentralizedFileFormat> fileFormat(new CentralizedFileFormat);
    fileFormat->Init(directory, prefix, globalMetainfo_, fieldsTable_, offsetTable_);
    pFileFormat_ = fileFormat;

    // Clean the tables if mode is write
    if (mode_ == SerializerOpenModeWrite)
        pFileFormat_->CleanTables();
    else
        pFileFormat_->ImportTables();

    // Initiaize binary serializer
    binarySerializer_.Init();

    // Register basic metainfo
    if (!globalMetainfo_.HasKey("__format"))
        globalMetainfo_.AddMetainfo("__format", pFileFormat_->FormatName());
    //if (!globalMetainfo_.HasKey("__created"))
    //    globalMetainfo_.AddMetainfo("__created", /* TODO : add date (timestamp) */);
}